

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O1

Vec_Ptr_t * Aig_ManReduceLachesOnce(Aig_Man_t *p)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  size_t __size;
  void *pvVar14;
  long lVar15;
  
  iVar4 = p->nObjs[2];
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar4 - 1U) {
    iVar11 = iVar4;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar5->pArray = ppvVar6;
  if (p->nRegs < p->nObjs[2]) {
    lVar15 = 0;
    do {
      if (p->vCis->nSize <= lVar15) goto LAB_006c8204;
      pvVar7 = p->vCis->pArray[lVar15];
      uVar8 = pVVar5->nSize;
      uVar13 = pVVar5->nCap;
      if (uVar8 == uVar13) {
        if ((int)uVar13 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar13 * 2;
          if (iVar4 <= (int)uVar13) goto LAB_006c7fe1;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar13 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar13 << 4);
          }
        }
        pVVar5->pArray = ppvVar6;
        pVVar5->nCap = iVar4;
      }
LAB_006c7fe1:
      pVVar5->nSize = uVar8 + 1;
      pVVar5->pArray[(int)uVar8] = pvVar7;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (long)p->nObjs[2] - (long)p->nRegs);
  }
  __size = (long)p->vObjs->nSize << 3;
  pvVar7 = malloc(__size);
  memset(pvVar7,0xff,__size);
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar11 = 0;
    do {
      uVar8 = (p->nObjs[3] - iVar4) + iVar11;
      if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) goto LAB_006c8204;
      iVar4 = p->nObjs[2] - iVar4;
      uVar13 = iVar11 + iVar4;
      if ((int)uVar13 < 0) goto LAB_006c8204;
      iVar2 = p->vCis->nSize;
      if (iVar2 <= (int)uVar13) goto LAB_006c8204;
      ppvVar6 = p->vCis->pArray;
      pvVar14 = ppvVar6[uVar13];
      uVar9 = *(ulong *)((long)p->vCos->pArray[uVar8] + 8);
      uVar12 = uVar9 & 0xfffffffffffffffe;
      uVar3 = *(ulong *)(uVar12 + 0x18);
      if ((uVar9 & 1) == 0) {
        if ((uVar3 & 0x10) == 0) {
          *(ulong *)(uVar12 + 0x18) = uVar3 | 0x10;
          *(int *)((long)pvVar7 + (long)*(int *)(uVar12 + 0x24) * 8) = iVar11;
        }
        else {
          uVar8 = iVar4 + *(int *)((long)pvVar7 + (long)*(int *)(uVar12 + 0x24) * 8);
          if ((int)uVar8 < 0) goto LAB_006c8204;
LAB_006c810b:
          if (iVar2 <= (int)uVar8) goto LAB_006c8204;
          pvVar14 = ppvVar6[uVar8];
        }
      }
      else {
        if ((uVar3 & 0x20) != 0) {
          uVar8 = iVar4 + *(int *)((long)pvVar7 + (long)*(int *)(uVar12 + 0x24) * 8 + 4);
          if (-1 < (int)uVar8) goto LAB_006c810b;
          goto LAB_006c8204;
        }
        *(ulong *)(uVar12 + 0x18) = uVar3 | 0x20;
        *(int *)((long)pvVar7 + (long)*(int *)(uVar12 + 0x24) * 8 + 4) = iVar11;
      }
      uVar8 = pVVar5->nCap;
      uVar13 = pVVar5->nSize;
      if (uVar13 == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar8 * 2;
          if (iVar4 <= (int)uVar8) goto LAB_006c817d;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar8 << 4);
          }
        }
        pVVar5->pArray = ppvVar6;
        pVVar5->nCap = iVar4;
      }
LAB_006c817d:
      pVVar5->nSize = uVar13 + 1;
      pVVar5->pArray[(int)uVar13] = pvVar14;
      iVar11 = iVar11 + 1;
      iVar4 = p->nRegs;
    } while (iVar11 < iVar4);
  }
  if (pvVar7 != (void *)0x0) {
    free(pvVar7);
  }
  uVar8 = p->nObjs[3] - iVar4;
  pVVar10 = p->vCos;
  if ((int)uVar8 < pVVar10->nSize) {
    uVar9 = (ulong)uVar8;
    do {
      if ((int)uVar8 < 0) {
LAB_006c8204:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((*(ulong *)((long)pVVar10->pArray[uVar9] + 8) & 0xfffffffffffffffe) + 0x18)
      ;
      *puVar1 = *puVar1 & 0xffffffffffffffcf;
      uVar9 = uVar9 + 1;
      pVVar10 = p->vCos;
    } while ((int)uVar9 < pVVar10->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Aig_ManReduceLachesOnce( Aig_Man_t * p )
{
    Vec_Ptr_t * vMap;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pFanin;
    int * pMapping, i;
    // start mapping by adding the true PIs
    vMap = Vec_PtrAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Vec_PtrPush( vMap, pObj );
    // create mapping of fanin nodes into the corresponding latch outputs
    pMapping = ABC_FALLOC( int, 2 * Aig_ManObjNumMax(p) );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pFanin = Aig_ObjFanin0(pObjLi);
        if ( Aig_ObjFaninC0(pObjLi) )
        {
            if ( pFanin->fMarkB )
            {
                Vec_PtrPush( vMap, Aig_ManLo(p, pMapping[2*pFanin->Id + 1]) );
            }
            else
            {
                pFanin->fMarkB = 1;
                pMapping[2*pFanin->Id + 1] = i;
                Vec_PtrPush( vMap, pObjLo );
            }
        }
        else
        {
            if ( pFanin->fMarkA )
            {
                Vec_PtrPush( vMap, Aig_ManLo(p, pMapping[2*pFanin->Id]) );
            }
            else
            {
                pFanin->fMarkA = 1;
                pMapping[2*pFanin->Id] = i;
                Vec_PtrPush( vMap, pObjLo );
            }
        }
    }
    ABC_FREE( pMapping );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
    return vMap;
}